

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

int build_outdirs(cmd_ln_t *config,char *uttid)

{
  char *dir;
  char *uttpath;
  char *uttid_local;
  cmd_ln_t *config_local;
  
  dir = __ckd_salloc__(uttid,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                       ,0x19b);
  path2dirname(uttid,dir);
  build_outdir_one(config,"outlatdir",dir);
  build_outdir_one(config,"mfclogdir",dir);
  build_outdir_one(config,"rawlogdir",dir);
  build_outdir_one(config,"senlogdir",dir);
  build_outdir_one(config,"nbestdir",dir);
  ckd_free(dir);
  return 0;
}

Assistant:

static int
build_outdirs(cmd_ln_t *config, char const *uttid)
{
    char *uttpath = ckd_salloc(uttid);

    path2dirname(uttid, uttpath);
    build_outdir_one(config, "outlatdir", uttpath);
    build_outdir_one(config, "mfclogdir", uttpath);
    build_outdir_one(config, "rawlogdir", uttpath);
    build_outdir_one(config, "senlogdir", uttpath);
    build_outdir_one(config, "nbestdir", uttpath);
    ckd_free(uttpath);

    return 0;
}